

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O3

void __thiscall avro::anon_unknown_3::FileBufferCopyIn::seek(FileBufferCopyIn *this,size_t len)

{
  __off_t _Var1;
  Exception *this_00;
  int *piVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  char *local_110;
  put_holder<char,_std::char_traits<char>_> local_108;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  
  _Var1 = lseek(this->fd_,len,1);
  if (_Var1 != -1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f0,"Cannot skip file: %1%");
  piVar2 = __errno_location();
  local_110 = strerror(*piVar2);
  local_108.arg = &local_110;
  local_108.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,char*const>;
  local_108.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,char*const>;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_f0,&local_108);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void seek(size_t len) {
        off_t r = ::lseek(fd_, len, SEEK_CUR);
        if (r == static_cast<off_t>(-1)) {
            throw Exception(boost::format("Cannot skip file: %1%") %
                strerror(errno));
        }
    }